

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseService(Parser *this,char *filename)

{
  bool bVar1;
  ServiceDef *this_00;
  ulong uVar2;
  string *psVar3;
  RPCCall *this_01;
  pointer in_RDX;
  int t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  RPCCall *local_1c8;
  RPCCall *rpc;
  string local_1b8 [36];
  byte local_194;
  byte local_193;
  byte local_192;
  byte local_191;
  undefined1 local_190 [8];
  Type resptype;
  Type reqtype;
  undefined1 local_148 [8];
  string rpc_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  ServiceDef *local_80;
  ServiceDef *service_def;
  undefined1 local_70 [8];
  string service_name;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  service_comment;
  char *filename_local;
  Parser *this_local;
  CheckedError *ce;
  
  service_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(filename + 0x48));
  Next(this);
  service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
  service_name.field_2._9_3_ = 0;
  if (!(bool)service_name.field_2._M_local_buf[8]) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (service_name.field_2._8_4_ == 0) {
    std::__cxx11::string::string((string *)local_70,(string *)(filename + 0x28));
    service_def._7_1_ = 0;
    t = (int)filename;
    Expect(this,t);
    service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
    if ((bool)service_name.field_2._M_local_buf[8]) {
      service_def._7_1_ = 1;
    }
    service_name.field_2._9_3_ = 0;
    if ((service_def._7_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (service_name.field_2._8_4_ == 0) {
      this_00 = (ServiceDef *)operator_new(0x110);
      memset(this_00,0,0x110);
      ServiceDef::ServiceDef(this_00);
      local_80 = this_00;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
      std::__cxx11::string::operator=
                ((string *)&(local_80->super_Definition).file,(string *)(filename + 0x708));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(local_80->super_Definition).doc_comment,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
      (local_80->super_Definition).defined_namespace = *(Namespace **)(filename + 0x198);
      if ((service_comment.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
         (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   (char *)service_comment.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c1);
        FilePath(&local_a0,(string *)(filename + 0x620),&local_c0,(bool)(filename[0x4e4] & 1));
        psVar3 = GetPooledString((Parser *)filename,&local_a0);
        (local_80->super_Definition).declaration_file = psVar3;
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      Namespace::GetFullyQualifiedName
                (&local_e8,*(Namespace **)(filename + 0x198),(string *)local_70,1000);
      bVar1 = SymbolTable<flatbuffers::ServiceDef>::Add
                        ((SymbolTable<flatbuffers::ServiceDef> *)(filename + 0x138),&local_e8,
                         local_80);
      std::__cxx11::string::~string((string *)&local_e8);
      if (bVar1) {
        std::operator+(&local_108,"service already exists: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
        Error(this,(string *)filename);
        std::__cxx11::string::~string((string *)&local_108);
        service_name.field_2._8_4_ = 1;
      }
      else {
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
        service_name.field_2._9_3_ = 0;
        if (!(bool)service_name.field_2._M_local_buf[8]) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (service_name.field_2._8_4_ == 0) {
          Expect(this,t);
          service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          service_name.field_2._9_3_ = 0;
          if (!(bool)service_name.field_2._M_local_buf[8]) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (service_name.field_2._8_4_ == 0) {
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&rpc_name.field_2 + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(filename + 0x48));
              std::__cxx11::string::string((string *)local_148,(string *)(filename + 0x28));
              Expect(this,t);
              service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
              service_name.field_2._9_3_ = 0;
              if (!(bool)service_name.field_2._M_local_buf[8]) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (service_name.field_2._8_4_ == 0) {
                Expect(this,t);
                service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                service_name.field_2._9_3_ = 0;
                if (!(bool)service_name.field_2._M_local_buf[8]) {
                  CheckedError::~CheckedError((CheckedError *)this);
                }
                if (service_name.field_2._8_4_ == 0) {
                  Type::Type((Type *)&resptype.fixed_length,BASE_TYPE_NONE,(StructDef *)0x0,
                             (EnumDef *)0x0,0);
                  Type::Type((Type *)local_190,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
                  local_191 = 0;
                  ParseTypeIdent(this,(Type *)filename);
                  service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
                  if ((bool)service_name.field_2._M_local_buf[8]) {
                    local_191 = 1;
                  }
                  service_name.field_2._9_3_ = 0;
                  if ((local_191 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (service_name.field_2._8_4_ == 0) {
                    local_192 = 0;
                    Expect(this,t);
                    service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this)
                    ;
                    if ((bool)service_name.field_2._M_local_buf[8]) {
                      local_192 = 1;
                    }
                    service_name.field_2._9_3_ = 0;
                    if ((local_192 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (service_name.field_2._8_4_ == 0) {
                      local_193 = 0;
                      Expect(this,t);
                      service_name.field_2._M_local_buf[8] =
                           CheckedError::Check((CheckedError *)this);
                      if ((bool)service_name.field_2._M_local_buf[8]) {
                        local_193 = 1;
                      }
                      service_name.field_2._9_3_ = 0;
                      if ((local_193 & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (service_name.field_2._8_4_ == 0) {
                        local_194 = 0;
                        ParseTypeIdent(this,(Type *)filename);
                        service_name.field_2._M_local_buf[8] =
                             CheckedError::Check((CheckedError *)this);
                        if ((bool)service_name.field_2._M_local_buf[8]) {
                          local_194 = 1;
                        }
                        service_name.field_2._9_3_ = 0;
                        if ((local_194 & 1) == 0) {
                          CheckedError::~CheckedError((CheckedError *)this);
                        }
                        if (service_name.field_2._8_4_ == 0) {
                          if ((((resptype._24_4_ == 0xf) &&
                               ((*(byte *)(reqtype._0_8_ + 0x110) & 1) == 0)) &&
                              (local_190._0_4_ == BASE_TYPE_STRUCT)) &&
                             ((*(byte *)(resptype._0_8_ + 0x110) & 1) == 0)) {
                            this_01 = (RPCCall *)operator_new(0xd8);
                            (this_01->super_Definition).declaration_file = (string *)0x0;
                            this_01->request = (StructDef *)0x0;
                            (this_01->super_Definition).serialized_location = 0;
                            (this_01->super_Definition).index = 0;
                            *(undefined8 *)&(this_01->super_Definition).refcount = 0;
                            *(undefined8 *)&(this_01->super_Definition).generated = 0;
                            (this_01->super_Definition).defined_namespace = (Namespace *)0x0;
                            (this_01->super_Definition).attributes.vec.
                            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            (this_01->super_Definition).attributes.vec.
                            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            (this_01->super_Definition).attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count = 0;
                            (this_01->super_Definition).attributes.vec.
                            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            *(_Base_ptr *)
                             ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.
                                     super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
                            *(_Base_ptr *)
                             ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.
                                     super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
                            *(undefined8 *)
                             &(this_01->super_Definition).attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_header = 0;
                            *(_Base_ptr *)
                             ((long)&(this_01->super_Definition).attributes.dict._M_t._M_impl.
                                     super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
                            (this_01->super_Definition).doc_comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            *(undefined8 *)&(this_01->super_Definition).attributes.dict._M_t._M_impl
                                 = 0;
                            (this_01->super_Definition).doc_comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            (this_01->super_Definition).doc_comment.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            (this_01->super_Definition).file.field_2._M_allocated_capacity = 0;
                            *(undefined8 *)((long)&(this_01->super_Definition).file.field_2 + 8) = 0
                            ;
                            *(undefined8 *)&(this_01->super_Definition).file = 0;
                            (this_01->super_Definition).file._M_string_length = 0;
                            (this_01->super_Definition).name.field_2._M_allocated_capacity = 0;
                            *(undefined8 *)((long)&(this_01->super_Definition).name.field_2 + 8) = 0
                            ;
                            *(undefined8 *)&(this_01->super_Definition).name = 0;
                            (this_01->super_Definition).name._M_string_length = 0;
                            this_01->response = (StructDef *)0x0;
                            RPCCall::RPCCall(this_01);
                            local_1c8 = this_01;
                            std::__cxx11::string::operator=((string *)this_01,(string *)local_148);
                            local_1c8->request = (StructDef *)reqtype._0_8_;
                            local_1c8->response = (StructDef *)resptype._0_8_;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator=(&(local_1c8->super_Definition).doc_comment,
                                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)((long)&rpc_name.field_2 + 8));
                            bVar1 = SymbolTable<flatbuffers::RPCCall>::Add
                                              (&local_80->calls,(string *)local_148,local_1c8);
                            if (bVar1) {
                              std::operator+(&local_1e8,"rpc already exists: ",
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_148);
                              Error(this,(string *)filename);
                              std::__cxx11::string::~string((string *)&local_1e8);
                              service_name.field_2._8_4_ = 1;
                            }
                            else {
                              ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
                              service_name.field_2._M_local_buf[8] =
                                   CheckedError::Check((CheckedError *)this);
                              service_name.field_2._9_3_ = 0;
                              if (!(bool)service_name.field_2._M_local_buf[8]) {
                                CheckedError::~CheckedError((CheckedError *)this);
                              }
                              if (service_name.field_2._8_4_ == 0) {
                                Expect(this,t);
                                service_name.field_2._M_local_buf[8] =
                                     CheckedError::Check((CheckedError *)this);
                                service_name.field_2._9_3_ = 0;
                                if (!(bool)service_name.field_2._M_local_buf[8]) {
                                  CheckedError::~CheckedError((CheckedError *)this);
                                }
                                if (service_name.field_2._8_4_ == 0) {
                                  service_name.field_2._8_4_ = 0;
                                }
                              }
                            }
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      (local_1b8,"rpc request and response types must be tables",
                                       (allocator<char> *)((long)&rpc + 7));
                            Error(this,(string *)filename);
                            std::__cxx11::string::~string(local_1b8);
                            std::allocator<char>::~allocator((allocator<char> *)((long)&rpc + 7));
                            service_name.field_2._8_4_ = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_148);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&rpc_name.field_2 + 8));
              if (service_name.field_2._8_4_ != 0) goto LAB_00140d0c;
            } while (*(int *)(filename + 0x1c) != 0x7d);
            Next(this);
            service_name.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
            service_name.field_2._9_3_ = 0;
            if (!(bool)service_name.field_2._M_local_buf[8]) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (service_name.field_2._8_4_ == 0) {
              anon_unknown_0::NoError();
              service_name.field_2._8_4_ = 1;
            }
          }
        }
      }
    }
LAB_00140d0c:
    std::__cxx11::string::~string((string *)local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseService(const char *filename) {
  std::vector<std::string> service_comment = doc_comment_;
  NEXT();
  auto service_name = attribute_;
  EXPECT(kTokenIdentifier);
  auto &service_def = *new ServiceDef();
  service_def.name = service_name;
  service_def.file = file_being_parsed_;
  service_def.doc_comment = service_comment;
  service_def.defined_namespace = current_namespace_;
  if (filename != nullptr && !opts.project_root.empty()) {
    service_def.declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  if (services_.Add(current_namespace_->GetFullyQualifiedName(service_name),
                    &service_def))
    return Error("service already exists: " + service_name);
  ECHECK(ParseMetaData(&service_def.attributes));
  EXPECT('{');
  do {
    std::vector<std::string> doc_comment = doc_comment_;
    auto rpc_name = attribute_;
    EXPECT(kTokenIdentifier);
    EXPECT('(');
    Type reqtype, resptype;
    ECHECK(ParseTypeIdent(reqtype));
    EXPECT(')');
    EXPECT(':');
    ECHECK(ParseTypeIdent(resptype));
    if (reqtype.base_type != BASE_TYPE_STRUCT || reqtype.struct_def->fixed ||
        resptype.base_type != BASE_TYPE_STRUCT || resptype.struct_def->fixed)
      return Error("rpc request and response types must be tables");
    auto &rpc = *new RPCCall();
    rpc.name = rpc_name;
    rpc.request = reqtype.struct_def;
    rpc.response = resptype.struct_def;
    rpc.doc_comment = doc_comment;
    if (service_def.calls.Add(rpc_name, &rpc))
      return Error("rpc already exists: " + rpc_name);
    ECHECK(ParseMetaData(&rpc.attributes));
    EXPECT(';');
  } while (token_ != '}');
  NEXT();
  return NoError();
}